

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nextval.cpp
# Opt level: O2

ScalarFunction * duckdb::CurrvalFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe84;
  FunctionNullHandling in_stack_fffffffffffffe90;
  bind_lambda_function_t in_stack_fffffffffffffe98;
  scalar_function_t local_160;
  LogicalType local_140;
  LogicalType local_128;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_110;
  LogicalType local_f8;
  string local_e0;
  BaseScalarFunction local_c0;
  
  ::std::__cxx11::string::string
            ((string *)&local_e0,"currval",(allocator *)&stack0xfffffffffffffe9f);
  LogicalType::LogicalType(&local_128,VARCHAR);
  __l._M_len = 1;
  __l._M_array = &local_128;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_110,__l,(allocator_type *)&stack0xfffffffffffffe9e);
  LogicalType::LogicalType(&local_140,BIGINT);
  local_160.super__Function_base._M_functor._8_8_ = 0;
  local_160.super__Function_base._M_functor._M_unused._M_object =
       NextValFunction<duckdb::CurrentSequenceValueOperator>;
  local_160._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_160.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_f8,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_f8;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffe7c;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffe84;
  ScalarFunction::ScalarFunction
            (in_RDI,&local_e0,(vector<duckdb::LogicalType,_true> *)&local_110,&local_140,&local_160,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
             in_stack_fffffffffffffe90,in_stack_fffffffffffffe98);
  LogicalType::~LogicalType(&local_f8);
  ::std::_Function_base::~_Function_base(&local_160.super__Function_base);
  LogicalType::~LogicalType(&local_140);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_110);
  LogicalType::~LogicalType(&local_128);
  ::std::__cxx11::string::~string((string *)&local_e0);
  in_RDI->bind_extended = NextValBind;
  (in_RDI->super_BaseScalarFunction).stability = VOLATILE;
  in_RDI->serialize = duckdb::Serialize;
  in_RDI->deserialize = duckdb::Deserialize;
  in_RDI->init_local_state = NextValLocalFunction;
  BaseScalarFunction::SetReturnsError(&local_c0,&in_RDI->super_BaseScalarFunction);
  BaseScalarFunction::~BaseScalarFunction(&local_c0);
  return in_RDI;
}

Assistant:

ScalarFunction CurrvalFun::GetFunction() {
	ScalarFunction curr_val("currval", {LogicalType::VARCHAR}, LogicalType::BIGINT,
	                        NextValFunction<CurrentSequenceValueOperator>, nullptr, nullptr);
	curr_val.bind_extended = NextValBind;
	curr_val.stability = FunctionStability::VOLATILE;
	curr_val.serialize = Serialize;
	curr_val.deserialize = Deserialize;
	curr_val.init_local_state = NextValLocalFunction;
	BaseScalarFunction::SetReturnsError(curr_val);
	return curr_val;
}